

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O2

void bsp_hpget(bsp_pid_t pid,void *src,bsp_size_t offset,void *dst,bsp_size_t nbytes)

{
  pointer pMVar1;
  ulong uVar2;
  void *pvVar3;
  Memslot src_slot;
  long lVar4;
  long lVar5;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_hpget: can only be called within SPMD section\n");
  }
  if (nbytes == 0) {
    return;
  }
  if ((pid < 0) || (s_spmd->m_nprocs < pid)) {
    bsp_abort("bsp_hpget: The source process ID does not exist\n");
  }
  if (offset < 0) {
    bsp_abort("bsp_hpget: The offset was negative, which is illegal\n");
  }
  if (nbytes < 0) {
    bsp_abort("bsp_hpget: The size was negative, which is illegal\n");
  }
  if (src == (void *)0x0) {
    bsp_abort("bsp_hpget: Source address cannot be identified by NULL\n");
  }
  src_slot = lookup_usable_reg(src,"bsp_hpget");
  lVar4 = (long)s_rdma->m_nprocs * src_slot;
  pMVar1 = (s_rdma->m_used_slots).
           super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = pMVar1[lVar4 + pid].size;
  lVar5 = (long)(nbytes + offset) - uVar2;
  if (uVar2 <= (ulong)(long)(nbytes + offset) && lVar5 != 0) {
    pvVar3 = pMVar1[lVar4 + pid].addr;
    bsp_abort("bsp_get: Reads %zu bytes beyond registered range [%p,%p+%zu) at process %d\n",lVar5,
              pvVar3,pvVar3,uVar2,pid);
  }
  if (s_spmd->m_pid == pid) {
    memcpy(dst,(void *)((long)src + (long)offset),(long)nbytes);
    return;
  }
  bsplib::Rdma::hpget(s_rdma,pid,src_slot,(long)offset,dst,(long)nbytes);
  return;
}

Assistant:

void bsp_hpget( bsp_pid_t pid, const void * src, bsp_size_t offset,
        void * dst, bsp_size_t nbytes )
{
#ifdef PROFILE
    TicToc t( TicToc::HPGET, nbytes );
#endif

    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_hpget: can only be called within SPMD section\n");

    if (nbytes == 0) // ignore any empty reads
        return;

    if (pid < 0 || pid > s_spmd->nprocs())
        bsp_abort("bsp_hpget: The source process ID does not exist\n");

    if (offset < 0)
        bsp_abort("bsp_hpget: The offset was negative, which is illegal\n");
    
    if (nbytes< 0)
        bsp_abort("bsp_hpget: The size was negative, which is illegal\n");

    if ( src == NULL )
        bsp_abort("bsp_hpget: Source address cannot be identified by NULL\n");

    bsplib::Rdma::Memslot src_slot_id = lookup_usable_reg( src, "bsp_hpget" );
    bsplib::Rdma::Memblock src_slot = s_rdma->slot( pid, src_slot_id );

    if ( size_t(offset + nbytes) > src_slot.size )
        bsp_abort("bsp_get: Reads %zu bytes beyond registered "
                  "range [%p,%p+%zu) at process %d\n",
                  offset + nbytes - src_slot.size,
                  src_slot.addr, src_slot.addr, src_slot.size, pid );

    if (pid == s_spmd->pid() )
        std::memcpy(dst, static_cast<const char *>(src) + offset, nbytes);
    else
        s_rdma->hpget( pid, src_slot_id , offset, dst, nbytes );
}